

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tank.cpp
# Opt level: O2

void __thiscall Tank::print_out_of_map(Tank *this)

{
  ostream *poVar1;
  string sStack_28;
  
  to_str_abi_cxx11_(&sStack_28,this);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&sStack_28);
  poVar1 = std::operator<<(poVar1," rolled out of battlefield");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&sStack_28);
  return;
}

Assistant:

void Tank::print_out_of_map() const {
    std::cout << to_str() << " rolled out of battlefield" << std::endl;
}